

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O1

void __thiscall llvm::yaml::Output::outputUpToEndOfLine(Output *this,StringRef s)

{
  ulong uVar1;
  
  this->Column = this->Column + (int)s.Length;
  raw_ostream::operator<<(this->Out,s);
  uVar1 = (ulong)(this->StateStack).super_SmallVectorImpl<llvm::yaml::Output::InState>.
                 super_SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>.
                 super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>.
                 super_SmallVectorBase.Size;
  if ((uVar1 == 0) ||
     ((*(uint *)((long)(this->StateStack).super_SmallVectorImpl<llvm::yaml::Output::InState>.
                       super_SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>.
                       super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>.
                       super_SmallVectorBase.BeginX + uVar1 * 4 + -4) & 0xfffffffe | 4) != 6)) {
    (this->Padding).Data = "\n";
    (this->Padding).Length = 1;
  }
  return;
}

Assistant:

void Output::outputUpToEndOfLine(StringRef s) {
  output(s);
  if (StateStack.empty() || (!inFlowSeqAnyElement(StateStack.back()) &&
                             !inFlowMapAnyKey(StateStack.back())))
    Padding = "\n";
}